

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O1

target_ulong helper_clcs_ppc64(CPUPPCState_conflict2 *env,uint32_t arg)

{
  int iVar1;
  
  switch(arg) {
  case 0xc:
    return (long)env->icache_line_size;
  case 0xd:
    return (long)env->dcache_line_size;
  case 0xe:
    iVar1 = env->dcache_line_size;
    if (env->icache_line_size < env->dcache_line_size) {
      iVar1 = env->icache_line_size;
    }
    break;
  case 0xf:
    iVar1 = env->dcache_line_size;
    if (env->dcache_line_size < env->icache_line_size) {
      iVar1 = env->icache_line_size;
    }
    break;
  default:
    return 0;
  }
  return (long)iVar1;
}

Assistant:

target_ulong helper_clcs(CPUPPCState *env, uint32_t arg)
{
    switch (arg) {
    case 0x0CUL:
        /* Instruction cache line size */
        return env->icache_line_size;
        break;
    case 0x0DUL:
        /* Data cache line size */
        return env->dcache_line_size;
        break;
    case 0x0EUL:
        /* Minimum cache line size */
        return (env->icache_line_size < env->dcache_line_size) ?
            env->icache_line_size : env->dcache_line_size;
        break;
    case 0x0FUL:
        /* Maximum cache line size */
        return (env->icache_line_size > env->dcache_line_size) ?
            env->icache_line_size : env->dcache_line_size;
        break;
    default:
        /* Undefined */
        return 0;
        break;
    }
}